

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManFindCutUnmark_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (((*(ulong *)pObj >> 0x3e & 1) != 0) &&
     (*(ulong *)pObj = *(ulong *)pObj & 0xbfffffffffffffff, (*(ulong *)pObj >> 0x1e & 1) == 0)) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x6d7,"void Sbd_ManFindCutUnmark_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    Sbd_ManFindCutUnmark_rec(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Sbd_ManFindCutUnmark_rec(p,pGVar2);
  }
  return;
}

Assistant:

void Sbd_ManFindCutUnmark_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !pObj->fMark1 )
        return;
    pObj->fMark1 = 0;
    if ( pObj->fMark0 )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Sbd_ManFindCutUnmark_rec( p, Gia_ObjFanin0(pObj) );
    Sbd_ManFindCutUnmark_rec( p, Gia_ObjFanin1(pObj) );
}